

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

void equip_learn_on_melee_attack(player *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  player_shape *ppVar3;
  wchar_t wVar4;
  
  if ((p->obj_k->to_h == 0) || (p->obj_k->to_d == 0)) {
    for (wVar4 = L'\0'; (uint)wVar4 < (uint)(p->body).count; wVar4 = wVar4 + L'\x01') {
      obj = slot_object(p,wVar4);
      wVar2 = slot_by_name(p,"shooting");
      if (obj != (object *)0x0 && wVar4 != wVar2) {
        if (obj->known == (object *)0x0) {
          __assert_fail("obj->known",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-knowledge.c"
                        ,0x85b,"void equip_learn_on_melee_attack(struct player *)");
        }
        _Var1 = object_has_standard_dice(obj);
        if (!_Var1) {
          wVar2 = rune_index(0,L'\x04');
          player_learn_rune(p,(long)wVar2,true);
        }
        _Var1 = object_has_standard_to_h(obj);
        if (!_Var1) {
          wVar2 = rune_index(0,L'\x01');
          player_learn_rune(p,(long)wVar2,true);
        }
        if (obj->to_d != 0) {
          wVar2 = rune_index(0,L'\x02');
          player_learn_rune(p,(long)wVar2,true);
        }
        object_curses_find_to_h(p,obj);
        object_curses_find_to_d(p,obj);
        if ((p->obj_k->to_h != 0) && (p->obj_k->to_d != 0)) {
          return;
        }
      }
    }
    if (p->shape != (player_shape *)0x0) {
      ppVar3 = lookup_player_shape(p->shape->name);
      if (ppVar3->to_h != L'\0') {
        wVar4 = rune_index(0,L'\x01');
        player_learn_rune(p,(long)wVar4,true);
      }
      if (ppVar3->to_d != L'\0') {
        wVar4 = rune_index(0,L'\x02');
        player_learn_rune(p,(long)wVar4,true);
        return;
      }
    }
  }
  return;
}

Assistant:

void equip_learn_on_melee_attack(struct player *p)
{
	int i;

	if (p->obj_k->to_h && p->obj_k->to_d)
		return;

	for (i = 0; i < p->body.count; i++) {
		struct object *obj = slot_object(p, i);
		if (i == slot_by_name(p, "shooting")) continue;
		if (obj) {
			assert(obj->known);
			if (!object_has_standard_dice(obj)) {
				int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_DICE);
				player_learn_rune(p, index, true);
			}
			if (!object_has_standard_to_h(obj)) {
				int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
				player_learn_rune(p, index, true);
			}
			if (obj->to_d) {
				int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_D);
				player_learn_rune(p, index, true);
			}
			object_curses_find_to_h(p, obj);
			object_curses_find_to_d(p, obj);
			if (p->obj_k->to_h && p->obj_k->to_d) return;
		}
	}
	if (p->shape) {
		struct player_shape *shape = lookup_player_shape(p->shape->name);
		if (shape->to_h != 0) {
			int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
			player_learn_rune(p, index, true);
		}
		if (shape->to_d != 0) {
			int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_D);
			player_learn_rune(p, index, true);
		}
	}
}